

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::tab_r::cdf1(tab_r *this,float_t u1,float_t zi)

{
  float_t fVar1;
  vec2 local_3c;
  float_t eval;
  float_t local_28;
  float_t bmax;
  float_t local_1c;
  float_t local_18;
  float_t bmin;
  float_t zi_local;
  float_t u1_local;
  tab_r *this_local;
  
  local_18 = zi;
  bmin = u1;
  _zi_local = this;
  vec2::vec2((vec2 *)&stack0xffffffffffffffdc,0.0,1.0);
  local_1c = cdf(this,(vec2 *)&stack0xffffffffffffffdc,local_18);
  vec2::vec2((vec2 *)&stack0xffffffffffffffd0,1.0,1.0);
  local_28 = cdf(this,(vec2 *)&stack0xffffffffffffffd0,local_18);
  vec2::vec2(&local_3c,bmin,1.0);
  fVar1 = cdf(this,&local_3c,local_18);
  return (fVar1 - local_1c) / (local_28 - local_1c);
}

Assistant:

float_t tab_r::cdf1(float_t u1, float_t zi) const
{
	float_t bmin = cdf(vec2( 0, 1), zi);
	float_t bmax = cdf(vec2( 1, 1), zi);
	float_t eval = cdf(vec2(u1, 1), zi);

	return (eval - bmin) / (bmax - bmin);
}